

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O0

void ApprovalTests::CartesianProduct::
     cartesian_product<ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::serialize<DOCTEST_ANON_FUNC_6()::__0>,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
               (serialize<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_CustomizingToStringTests_cpp:69:9)>
                *f,vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *ranges,
               vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *ranges_1)

{
  bool bVar1;
  tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
  *t;
  dereference_iterator *in_RDI;
  tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
  its;
  tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
  ends;
  tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
  begins;
  vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *in_stack_ffffffffffffff58;
  dereference_iterator *in_stack_ffffffffffffff60;
  vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *in_stack_ffffffffffffff68;
  tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined1 local_28 [32];
  dereference_iterator *local_8;
  
  local_8 = in_RDI;
  ::std::
  forward_as_tuple<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>const&,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>const&>
            (in_stack_ffffffffffffff68,
             (vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *)
             in_stack_ffffffffffffff60);
  bVar1 = Detail::
          any_of<ApprovalTests::CartesianProduct::Detail::is_range_empty,std::tuple<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>const&,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>const&>>
                    (local_28);
  if (!bVar1) {
    ::std::begin<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
              (in_stack_ffffffffffffff58);
    ::std::begin<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
              (in_stack_ffffffffffffff58);
    ::std::
    make_tuple<__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>
              ((__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                *)in_stack_ffffffffffffff68,
               (__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                *)in_stack_ffffffffffffff60);
    ::std::end<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
              (in_stack_ffffffffffffff58);
    ::std::end<std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
              (in_stack_ffffffffffffff58);
    ::std::
    make_tuple<__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>
              ((__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                *)in_stack_ffffffffffffff68,
               (__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                *)in_stack_ffffffffffffff60);
    while( true ) {
      t = (tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
           *)::std::
             get<0ul,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>
                       ((tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
                         *)0x161332);
      ::std::
      get<0ul,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>
                ((tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
                  *)0x161341);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                          *)in_stack_ffffffffffffff60,
                         (__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>
                          *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      in_stack_ffffffffffffff60 = local_8;
      Detail::
      transform<ApprovalTests::CartesianProduct::Detail::dereference_iterator,std::tuple<__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>&>
                (t,local_8);
      Detail::
      apply<ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::serialize<DOCTEST_ANON_FUNC_6()::__0>,std::tuple<StringMakerPrintable,StringMakerPrintable>>
                ((serialize<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_CustomizingToStringTests_cpp:69:9)>
                  *)in_stack_ffffffffffffff60,
                 (tuple<StringMakerPrintable,_StringMakerPrintable> *)in_stack_ffffffffffffff58);
      Detail::
      increment_iterator<std::tuple<__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>,__gnu_cxx::__normal_iterator<StringMakerPrintable_const*,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>>,1ul>
                (in_stack_ffffffffffffff70,t,
                 (tuple<__gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>,___gnu_cxx::__normal_iterator<const_StringMakerPrintable_*,_std::vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>_>_>
                  *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void cartesian_product(F&& f, const Ranges&... ranges)
        {
            using std::begin;
            using std::end;

            if (Detail::any_of<Detail::is_range_empty>(std::forward_as_tuple(ranges...)))
                return;

            const auto begins = std::make_tuple(begin(ranges)...);
            const auto ends = std::make_tuple(end(ranges)...);

            for (auto its = begins; std::get<0>(its) != std::get<0>(ends);
                 Detail::increment_iterator(its, begins, ends))
            {
                // Command-clicking on transform in CLion 2019.2.1 hangs with CLion with high CPU
                // 'Use clang tidy' is turned off.
                // Power-save turned on.
                // Mac
                Detail::apply(std::forward<F>(f),
                              Detail::transform<Detail::dereference_iterator>(its));
            }
        }